

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O1

void ON_qsort(void *base,size_t nel,size_t width,_func_int_void_ptr_void_ptr_void_ptr *compar,
             void *context)

{
  ON_hsort(base,nel,width,compar,context);
  return;
}

Assistant:

void 
ON_qsort( void *base, size_t nel, size_t width, int (*compar)(void*,const void *, const void *),void* context)
{
#if defined(ON__HAVE_RELIABLE_SYSTEM_CONTEXT_QSORT)
  // The call here must be a thread safe system qsort
  // that is faster than the alternative code in this function.
  // In particular, if it uses a random number generator to
  // find pivots, that calculation must be thread safe.
#if defined(ON_COMPILER_MSC)
  qsort_s(base,nel,width,compar,context);
#elif defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  ON_hsort(base, nel, width, compar, context);
#elif defined(ON_COMPILER_CLANG)
  qsort_r(base,nel,width,context,compar);
#elif defined(_GNU_SOURCE)
  qsort_r(base,nel,width,context,compar);
#endif
#else
  ON_hsort(base, nel, width, compar, context);
#endif
}